

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harris.cpp
# Opt level: O2

Harris * __thiscall Harris::MeanFilter(Harris *this,Mat *intImg,int range)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  long lVar5;
  int in_ECX;
  long lVar6;
  undefined4 in_register_00000014;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  
  lVar7 = CONCAT44(in_register_00000014,range);
  cv::Mat::Mat(&this->harrisResponses,*(int *)(lVar7 + 8) + in_ECX * -2,
               *(int *)(lVar7 + 0xc) + in_ECX * -2,5);
  iVar1 = *(int *)(lVar7 + 8);
  lVar6 = (long)in_ECX;
  iVar2 = *(int *)(lVar7 + 0xc);
  lVar5 = lVar6 * 2;
  lVar11 = 0;
  for (lVar12 = lVar6; lVar12 < iVar1 - lVar6; lVar12 = lVar12 + 1) {
    lVar13 = *(long *)(lVar7 + 0x10);
    plVar3 = *(long **)(lVar7 + 0x48);
    lVar15 = *(long *)&this->field_0x10;
    plVar4 = *(long **)&this->field_0x48;
    lVar14 = lVar13 + lVar6 * 8;
    for (lVar8 = lVar6; lVar8 < iVar2 - lVar6; lVar8 = lVar8 + 1) {
      lVar9 = lVar5 * *plVar3;
      lVar10 = *plVar3 * lVar11;
      *(float *)(lVar15 + *plVar4 * lVar11) =
           ((*(float *)(lVar14 + lVar9) + *(float *)(lVar13 + lVar10)) - *(float *)(lVar13 + lVar9))
           - *(float *)(lVar14 + lVar10);
      lVar14 = lVar14 + 4;
      lVar13 = lVar13 + 4;
      lVar15 = lVar15 + 4;
    }
    lVar5 = lVar5 + 1;
    lVar11 = lVar11 + 1;
  }
  return this;
}

Assistant:

Mat Harris::MeanFilter(Mat& intImg, int range) {
    Mat medianFilteredMat(intImg.rows-range*2, intImg.cols-range*2, CV_32F);

    for (int r = range; r < intImg.rows-range; r++) {
        for (int c = range; c < intImg.cols-range; c++) {
            medianFilteredMat.at<float>(r-range, c-range) = 
                intImg.at<float>(r+range, c+range)
                + intImg.at<float>(r-range, c-range)
                - intImg.at<float>(r+range, c-range)
                - intImg.at<float>(r-range, c+range);
        }
    }

    return medianFilteredMat;
}